

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

int __thiscall Dashel::Hub::connect(Hub *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  DashelException *pDVar2;
  Stream *pSVar3;
  char *reason;
  undefined4 in_register_00000034;
  pair<std::_Rb_tree_const_iterator<Dashel::Stream_*>,_bool> pVar4;
  int local_1a0;
  long local_190;
  value_type local_168;
  value_type local_140;
  long *local_120;
  value_type local_e0;
  _Base_ptr local_d8;
  undefined1 local_d0;
  value_type local_c8;
  string local_c0;
  allocator<char> local_99;
  string local_98 [8];
  string r;
  SelectableStream *s;
  long local_40;
  size_t c;
  string proto;
  string *target_local;
  Hub *this_local;
  
  proto.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string((string *)&c);
  local_40 = std::__cxx11::string::find_first_of((char)proto.field_2._8_8_,0x3a);
  if (local_40 == -1) {
    pDVar2 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar2,InvalidTarget,0,"No protocol specified in target.",(Stream *)0x0);
    __cxa_throw(pDVar2,&DashelException::typeinfo,DashelException::~DashelException);
  }
  std::__cxx11::string::substr((ulong)&s,proto.field_2._8_8_);
  std::__cxx11::string::operator=((string *)&c,(string *)&s);
  std::__cxx11::string::~string((string *)&s);
  pSVar3 = StreamTypeRegistry::create
                     ((StreamTypeRegistry *)streamTypeRegistry,(string *)&c,
                      (string *)proto.field_2._8_8_,this);
  if (pSVar3 == (Stream *)0x0) {
    local_120 = (long *)0x0;
  }
  else {
    local_120 = (long *)__dynamic_cast(pSVar3,&Stream::typeinfo,&SelectableStream::typeinfo,
                                       0xffffffffffffffff);
  }
  r.field_2._8_8_ = local_120;
  if (local_120 != (long *)0x0) {
    local_140 = (value_type)0x0;
    if (local_120 != (long *)0x0) {
      local_140 = (value_type)((long)local_120 + *(long *)(*local_120 + -0x18));
    }
    local_c8 = local_140;
    pVar4 = std::
            set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::
            insert(&this->streams,&local_c8);
    local_d8 = (_Base_ptr)pVar4.first._M_node;
    local_d0 = pVar4.second;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                            "tcpin");
    if (bVar1) {
      local_168 = (value_type)0x0;
      if (r.field_2._8_8_ != 0) {
        local_168 = (value_type)(r.field_2._8_8_ + *(long *)(*(long *)r.field_2._8_8_ + -0x18));
      }
      local_e0 = local_168;
      std::set<Dashel::Stream_*,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>::
      insert(&this->dataStreams,&local_e0);
      local_190 = 0;
      if (r.field_2._8_8_ != 0) {
        local_190 = r.field_2._8_8_ + *(long *)(*(long *)r.field_2._8_8_ + -0x18);
      }
      (*this->_vptr_Hub[2])(this,local_190);
    }
    local_1a0 = 0;
    if (r.field_2._8_8_ != 0) {
      local_1a0 = (int)r.field_2._8_8_ + (int)*(undefined8 *)(*(long *)r.field_2._8_8_ + -0x18);
    }
    std::__cxx11::string::~string((string *)&c);
    return local_1a0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"Invalid protocol in target: ",&local_99);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::operator+=(local_98,(string *)&c);
  std::__cxx11::string::operator+=(local_98,", known protocol are: ");
  StreamTypeRegistry::list_abi_cxx11_(&local_c0,(StreamTypeRegistry *)streamTypeRegistry);
  std::__cxx11::string::operator+=(local_98,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  pDVar2 = (DashelException *)__cxa_allocate_exception(0x20);
  reason = (char *)std::__cxx11::string::c_str();
  DashelException::DashelException(pDVar2,InvalidTarget,0,reason,(Stream *)0x0);
  __cxa_throw(pDVar2,&DashelException::typeinfo,DashelException::~DashelException);
}

Assistant:

Stream* Hub::connect(const std::string& target)
	{
		std::string proto;
		size_t c = target.find_first_of(':');
		if (c == std::string::npos)
			throw DashelException(DashelException::InvalidTarget, 0, "No protocol specified in target.");
		proto = target.substr(0, c);
		// N.B. params = target.substr(c+1)

		SelectableStream* s(dynamic_cast<SelectableStream*>(streamTypeRegistry.create(proto, target, *this)));
		if (!s)
		{
			std::string r = "Invalid protocol in target: ";
			r += proto;
			r += ", known protocol are: ";
			r += streamTypeRegistry.list();
			throw DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}

		/* The caller must have the stream lock held */

		streams.insert(s);
		if (proto != "tcpin")
		{
			dataStreams.insert(s);
			connectionCreated(s);
		}

		return s;
	}